

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

void __thiscall QToolBoxPrivate::_q_widgetDestroyed(QToolBoxPrivate *this,QObject *object)

{
  pointer puVar1;
  QObject *this_00;
  Page *pPVar2;
  Page *pPVar3;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *puVar4;
  Page *pPVar5;
  Page *pPVar6;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  pointer puVar7;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *puVar8;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *puVar9;
  ulong uVar10;
  iterator __first;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (object != (QObject *)0x0) {
    puVar7 = (this->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != puVar1) {
      this_00 = *(QObject **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
      do {
        pPVar2 = (puVar7->_M_t).
                 super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                 .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
        if (pPVar2->widget == (QWidget *)object) {
          QLayout::removeWidget((QLayout *)this->layout,(QWidget *)pPVar2->sv);
          QLayout::removeWidget((QLayout *)this->layout,(QWidget *)pPVar2->button);
          QObject::deleteLater();
          if (pPVar2->button != (QToolBoxButton *)0x0) {
            (**(code **)(*(long *)&(pPVar2->button->super_QAbstractButton).super_QWidget + 0x20))();
          }
          pPVar3 = this->currentPage;
          puVar8 = (this->pageList).
                   super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar4 = (this->pageList).
                   super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar10 = (long)puVar4 - (long)puVar8;
          puVar9 = puVar8;
          uVar12 = uVar10;
          if ((long)uVar10 >> 5 < 1) goto LAB_004b86d8;
          puVar9 = (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *
                   )((long)&(puVar8->_M_t).
                            super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                            .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl +
                    (uVar10 & 0xffffffffffffffe0));
          lVar11 = ((long)uVar10 >> 5) + 1;
          __first._M_current = puVar8 + 2;
          goto LAB_004b86a6;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar1);
    }
  }
  goto LAB_004b8853;
  while( true ) {
    if (((__first._M_current)->_M_t).
        super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
        _M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2)
    goto LAB_004b875e;
    if (__first._M_current[1]._M_t.
        super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
        _M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2) {
      __first._M_current = __first._M_current + 1;
      goto LAB_004b875e;
    }
    lVar11 = lVar11 + -1;
    __first._M_current = __first._M_current + 4;
    if (lVar11 < 2) break;
LAB_004b86a6:
    if (__first._M_current[-2]._M_t.
        super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
        _M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2) {
      __first._M_current = __first._M_current + -2;
      goto LAB_004b875e;
    }
    if (__first._M_current[-1]._M_t.
        super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
        _M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2) {
      __first._M_current = __first._M_current + -1;
      goto LAB_004b875e;
    }
  }
  uVar12 = (long)puVar4 - (long)puVar9;
LAB_004b86d8:
  lVar11 = (long)uVar12 >> 3;
  if (lVar11 == 1) {
LAB_004b873c:
    __first._M_current = puVar9;
    if ((puVar9->_M_t).
        super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
        _M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
      __first._M_current = puVar4;
    }
LAB_004b875e:
    puVar9 = __first._M_current + 1;
    if (puVar9 != puVar4 && __first._M_current != puVar4) {
      do {
        pPVar5 = (puVar9->_M_t).
                 super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                 .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
        if (pPVar5 != pPVar2) {
          (puVar9->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl = (Page *)0x0;
          pPVar6 = ((__first._M_current)->_M_t).
                   super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                   .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
          ((__first._M_current)->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl = pPVar5;
          if (pPVar6 != (Page *)0x0) {
            operator_delete(pPVar6,0x18);
          }
          __first._M_current = __first._M_current + 1;
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar4);
      puVar8 = (this->pageList).
               super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->pageList).
                     super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
    }
  }
  else {
    if (lVar11 == 2) {
LAB_004b86fb:
      __first._M_current = puVar9;
      if ((puVar9->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
        puVar9 = puVar9 + 1;
        goto LAB_004b873c;
      }
      goto LAB_004b875e;
    }
    __first._M_current = puVar4;
    if (lVar11 == 3) {
      __first._M_current = puVar9;
      if ((puVar9->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
        puVar9 = puVar9 + 1;
        goto LAB_004b86fb;
      }
      goto LAB_004b875e;
    }
  }
  std::
  vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
  ::_M_erase(&this->pageList,__first,
             (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
             ((long)&(puVar8->_M_t).
                     super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                     .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl + uVar10));
  if ((this->pageList).
      super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pageList).
      super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->currentPage = (Page *)0x0;
    local_40 = &local_4c;
    local_4c = 0xffffffff;
    local_48 = (void *)0x0;
    QMetaObject::activate(this_00,&QToolBox::staticMetaObject,0,&local_48);
  }
  else if (pPVar2 == pPVar3) {
    this->currentPage = (Page *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QToolBox::setCurrentIndex((QToolBox *)this_00,0);
      return;
    }
    goto LAB_004b8872;
  }
LAB_004b8853:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004b8872:
  __stack_chk_fail();
}

Assistant:

void QToolBoxPrivate::_q_widgetDestroyed(QObject *object)
{
    Q_Q(QToolBox);

    const QToolBoxPrivate::Page * const c = page(object);
    if (!c)
        return;

    layout->removeWidget(c->sv);
    layout->removeWidget(c->button);
    c->sv->deleteLater(); // page might still be a child of sv
    delete c->button;

    bool removeCurrent = c == currentPage;
    pageList.erase(std::remove_if(pageList.begin(), pageList.end(), pageEquals(c)), pageList.end());

    if (pageList.empty()) {
        currentPage = nullptr;
        emit q->currentChanged(-1);
    } else if (removeCurrent) {
        currentPage = nullptr;
        q->setCurrentIndex(0);
    }
}